

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRHandler.cc
# Opt level: O2

void __thiscall flow::IRHandler::setEntryBlock(IRHandler *this,BasicBlock *bb)

{
  FILE *__stream;
  const_iterator __position;
  list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
  *this_00;
  allocator<char> local_31;
  _Head_base<0UL,_flow::BasicBlock_*,_false> local_30 [4];
  
  __stream = _stderr;
  if (bb->handler_ != (IRHandler *)0x0) {
    this_00 = &this->blocks_;
    __position._M_node = (_List_node_base *)this_00;
    while (__position._M_node = (__position._M_node)->_M_next,
          __position._M_node != (_List_node_base *)this_00) {
      if ((BasicBlock *)__position._M_node[1]._M_next == bb) {
        local_30[0]._M_head_impl = (BasicBlock *)__position._M_node[1]._M_next;
        __position._M_node[1]._M_next = (_List_node_base *)0x0;
        std::__cxx11::
        list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
        ::erase(this_00,__position);
        std::__cxx11::
        list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
        ::push_front(this_00,(value_type *)local_30);
        if (local_30[0]._M_head_impl != (BasicBlock *)0x0) {
          (*(code *)((_List_node_base *)((local_30[0]._M_head_impl)->super_Value)._vptr_Value)->
                    _M_prev)();
        }
        return;
      }
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_30,"BasicBlock must belong to this handler.",&local_31);
  fprintf(__stream,"%s\n",local_30[0]._M_head_impl);
  std::__cxx11::string::~string((string *)local_30);
  abort();
}

Assistant:

void IRHandler::setEntryBlock(BasicBlock* bb) {
  FLOW_ASSERT(bb->getHandler(), "BasicBlock must belong to this handler.");

  auto i = std::find_if(blocks_.begin(), blocks_.end(),
                        [&](const auto& obj) { return obj.get() == bb; });
  FLOW_ASSERT(i != blocks_.end(), "BasicBlock must belong to this handler.");
  std::unique_ptr<BasicBlock> t = std::move(*i);
  blocks_.erase(i);
  blocks_.push_front(std::move(t));
}